

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int message_set_application_properties(MESSAGE_HANDLE message,AMQP_VALUE application_properties)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  LOGGER_LOG l_1;
  AMQP_VALUE new_application_properties;
  LOGGER_LOG l;
  int result;
  AMQP_VALUE application_properties_local;
  MESSAGE_HANDLE message_local;
  
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                ,"message_set_application_properties",0x337,1,"NULL message");
    }
    l._4_4_ = 0x338;
  }
  else if (application_properties == (AMQP_VALUE)0x0) {
    if (message->application_properties != (application_properties)0x0) {
      amqpvalue_destroy(message->application_properties);
      message->application_properties = (application_properties)0x0;
    }
    l._4_4_ = 0;
  }
  else {
    pAVar2 = amqpvalue_clone(application_properties);
    if (pAVar2 == (AMQP_VALUE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_set_application_properties",0x352,1,
                  "Cannot clone application properties");
      }
      l._4_4_ = 0x353;
    }
    else {
      if (message->application_properties != (application_properties)0x0) {
        amqpvalue_destroy(message->application_properties);
      }
      message->application_properties = pAVar2;
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

int message_set_application_properties(MESSAGE_HANDLE message, AMQP_VALUE application_properties)
{
    int result;

    if (message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_066: [ If `message` is NULL, `message_set_application_properties` shall fail and return a non-zero value. ]*/
        LogError("NULL message");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE new_application_properties;

        /* Tests_SRS_MESSAGE_01_149: [ If `application_properties` is NULL, the previously stored application properties associated with `message` shall be freed. ]*/
        if (application_properties == NULL)
        {
            if (message->application_properties != NULL)
            {
                amqpvalue_destroy(message->application_properties);
                message->application_properties = NULL;
            }

            /* Codes_SRS_MESSAGE_01_065: [ On success it shall return 0. ]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_064: [ `message_set_application_properties` shall copy the contents of `application_properties` as the application properties for the message instance identified by `message`. ]*/
            /* Codes_SRS_MESSAGE_01_067: [ Cloning the message properties shall be done by calling `application_properties_clone`. ]*/
            new_application_properties = application_properties_clone(application_properties);
            if (new_application_properties == NULL)
            {
                /* Codes_SRS_MESSAGE_01_068: [ If `application_properties_clone` fails, `message_set_application_properties` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone application properties");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_069: [ If setting the application properties fails, the previous value shall be preserved. ]*/
                /* Only do the free of the previous value if we could clone the new one*/
                if (message->application_properties != NULL)
                {
                    amqpvalue_destroy(message->application_properties);
                }

                message->application_properties = new_application_properties;

                /* Codes_SRS_MESSAGE_01_065: [ On success it shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}